

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::TimeScaleDirectiveSyntax::getChildPtr(TimeScaleDirectiveSyntax *this,size_t index)

{
  undefined8 in_RSI;
  PtrTokenOrSyntax *in_RDI;
  Token *in_stack_ffffffffffffffc8;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 2:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax TimeScaleDirectiveSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &directive;
        case 1: return &timeUnit;
        case 2: return &slash;
        case 3: return &timePrecision;
        default: return nullptr;
    }
}